

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O3

void __thiscall AActor::Die(AActor *this,AActor *source,AActor *inflictor,int dmgflags)

{
  byte *pbVar1;
  int *piVar2;
  DBot *pDVar3;
  AActor *pAVar4;
  Node *pNVar5;
  undefined8 *puVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  FState *pFVar11;
  PClass *pPVar12;
  PClass *pPVar13;
  undefined4 extraout_var_01;
  player_t *ppVar14;
  long lVar15;
  PClassActor *this_00;
  DHUDMessageFadeOut *pDVar16;
  Node *pNVar17;
  undefined8 *puVar18;
  uint uVar19;
  long *plVar20;
  Node *pNVar22;
  AInventory *pAVar23;
  Node *pNVar24;
  player_t *ppVar25;
  AInventory *pAVar26;
  DBaseStatusBar *pDVar27;
  byte bVar28;
  char *pcVar29;
  int realstyle;
  AActor *realthis;
  int realhealth;
  char buff [256];
  uint local_164;
  AActor *local_160;
  FName local_158;
  FName local_154;
  FName local_150;
  FName local_14c;
  FName local_148;
  FName local_144;
  FName local_140;
  int local_13c;
  undefined8 local_138;
  int local_130;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  long lVar21;
  
  iVar9 = this->health;
  iVar8 = GetGibHealth(this);
  local_160 = (AActor *)0x0;
  local_164 = 0;
  local_13c = 0;
  bVar7 = P_MorphedDeath(this,&local_160,(int *)&local_164,&local_13c);
  if (bVar7) {
    if ((local_164 & 0x800) != 0) {
      return;
    }
    if ((iVar9 < iVar8) && (iVar9 = GetGibHealth(local_160), iVar9 <= local_160->health)) {
      local_160->health = iVar9 + -1;
    }
    CallDie(local_160,source,inflictor,dmgflags);
    return;
  }
  *(byte *)&this->effects = (byte)this->effects & 0xdf;
  if ((debugfile != (FILE *)0x0) && (this->player != (player_t *)0x0)) {
    fprintf((FILE *)debugfile,"died (%d) on tic %d (%s)\n",
            (ulong)(uint)((int)((ulong)&this->player[-0x9192].secretcount >> 5) * 0x3cf3cf3d),
            (ulong)(uint)gametic);
  }
  pAVar23 = (this->Inventory).field_0.p;
  if (pAVar23 != (AInventory *)0x0) {
    if (((pAVar23->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      do {
        pAVar26 = (pAVar23->super_AActor).Inventory.field_0.p;
        if (pAVar26 == (AInventory *)0x0) {
LAB_003fd1ba:
          pAVar26 = (AInventory *)0x0;
        }
        else if (((pAVar26->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
          (pAVar23->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
          goto LAB_003fd1ba;
        }
        (*(pAVar23->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x30])();
        pAVar23 = pAVar26;
      } while (pAVar26 != (AInventory *)0x0);
    }
    else {
      (this->Inventory).field_0.p = (AInventory *)0x0;
    }
  }
  uVar10 = (this->flags).Value;
  if ((uVar10 >> 0x10 & 1) != 0) {
    P_ExplodeMissile(this,(line_t_conflict *)0x0,(AActor *)0x0);
    return;
  }
  if (source != (AActor *)0x0) {
    (this->target).field_0.p = source;
  }
  if (((this->player == (player_t *)0x0) &&
      (uVar19 = (this->flags7).Value, (uVar19 >> 0x18 & 1) == 0)) &&
     (((uVar19 >> 0x17 & 1) != 0 || ((gameinfo.forcekillscripts & 1U) != 0)))) {
    FBehavior::StaticStartTypedScripts(0x11,this,true,0,true);
    uVar10 = (this->flags).Value;
  }
  uVar19 = uVar10 & 0xfeffbffb;
  (this->flags).Value = uVar19;
  if (((this->flags4).Value & 0x2000) == 0) {
    uVar19 = uVar10 & 0xfeffbdfb;
    (this->flags).Value = uVar19;
  }
  (this->flags).Value = uVar19 | 0x400;
  if (((this->flags3).Value & 0x2000) == 0) {
    local_140.Index = 0x8d;
    pFVar11 = FindState(this,&local_140);
    pPVar13 = APlayerPawn::RegistrationInfo.MyClass;
    if (pFVar11 != (FState *)0x0) goto LAB_003fd2e7;
    pPVar12 = (this->super_DThinker).super_DObject.Class;
    if (pPVar12 == (PClass *)0x0) {
      iVar9 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar12 = (PClass *)CONCAT44(extraout_var,iVar9);
      (this->super_DThinker).super_DObject.Class = pPVar12;
    }
    bVar7 = pPVar12 != (PClass *)0x0;
    if (pPVar12 != pPVar13 && bVar7) {
      do {
        pPVar12 = pPVar12->ParentClass;
        bVar7 = pPVar12 != (PClass *)0x0;
        if (pPVar12 == pPVar13) break;
      } while (pPVar12 != (PClass *)0x0);
    }
    if (bVar7) goto LAB_003fd2e7;
    uVar10 = (this->flags6).Value;
  }
  else {
LAB_003fd2e7:
    uVar10 = (this->flags6).Value;
    if ((uVar10 >> 0x19 & 1) == 0) {
      pbVar1 = (byte *)((long)&(this->flags).Value + 2);
      *pbVar1 = *pbVar1 | 0x10;
    }
  }
  (this->flags6).Value = uVar10 | 0x40000;
  pPVar13 = (this->super_DThinker).super_DObject.Class;
  if ((this->DamageType).super_FName.Index == 0xa4) {
    if (pPVar13 == (PClass *)0x0) {
      iVar9 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar13 = (PClass *)CONCAT44(extraout_var_00,iVar9);
      (this->super_DThinker).super_DObject.Class = pPVar13;
    }
    pcVar29 = *(char **)&pPVar13[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.loadOp;
    if ((double)pcVar29 < 0.0) goto LAB_003fd35c;
  }
  else {
    if (pPVar13 == (PClass *)0x0) {
      iVar9 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar13 = (PClass *)CONCAT44(extraout_var_01,iVar9);
      (this->super_DThinker).super_DObject.Class = pPVar13;
    }
LAB_003fd35c:
    pcVar29 = pPVar13[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.mDescriptiveName.Chars;
  }
  if (0.0 <= (double)pcVar29) {
    if ((double)pcVar29 <= 0.0) {
      pcVar29 = (char *)0x0;
    }
  }
  else {
    pcVar29 = (char *)(this->Height * 0.25);
  }
  this->Height = (double)pcVar29;
  uVar10 = (this->flags).Value;
  if ((this->special != 0) &&
     ((((uVar10 & 1) == 0 || (((this->flags3).Value & 0x2000) != 0)) &&
      ((this->activationtype & 0x40) == 0)))) {
    P_ActivateThingSpecial(this,source,true);
    uVar10 = (this->flags).Value;
  }
  uVar10 = uVar10 & 0x8400000;
  if (uVar10 == 0x400000) {
    level.killed_monsters = level.killed_monsters + 1;
  }
  if ((source == (AActor *)0x0) || (ppVar25 = source->player, ppVar25 == (player_t *)0x0)) {
    if ((uVar10 == 0x400000) && (multiplayer == false)) {
      DAT_017e1f38 = DAT_017e1f38 + 1;
    }
LAB_003fd4c3:
    ppVar14 = this->player;
  }
  else {
    if (uVar10 == 0x400000) {
      ppVar25->killcount = ppVar25->killcount + 1;
    }
    ppVar14 = this->player;
    if ((ppVar14 != (player_t *)0x0) && (level.maptime != 0)) {
      piVar2 = (int *)((long)ppVar25 +
                      ((long)&ppVar14[-0x9192].secretcount >> 5) * 0x3cf3cf3cf3cf3cf4 + 0xa4);
      *piVar2 = *piVar2 + 1;
      if (ppVar14 == ppVar25) {
        ppVar14->fragcount = ppVar14->fragcount + -1;
        if (((deathmatch.Value == 0) || (ppVar14->spreecount < 5)) || (cl_showsprees.Value != true))
        goto LAB_003fdd5a;
        pcVar29 = FStringTable::operator()(&GStrings,"SPREEKILLSELF");
        pNVar5 = (this->player->userinfo).
                 super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                 Nodes;
        uVar10 = (this->player->userinfo).
                 super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size
                 - 1;
        pNVar17 = pNVar5 + (uVar10 & 0x209);
        do {
          pNVar22 = pNVar17;
          pNVar17 = pNVar22->Next;
        } while ((pNVar22->Pair).Key.Index != 0x209);
        pNVar5 = pNVar5 + (uVar10 & 0x1ea);
        pNVar17 = pNVar5;
        do {
          pNVar24 = pNVar17;
          pNVar17 = pNVar24->Next;
        } while ((pNVar24->Pair).Key.Index != 0x1ea);
        do {
          pNVar17 = pNVar5;
          pNVar5 = pNVar17->Next;
        } while ((pNVar17->Pair).Key.Index != 0x1ea);
        SexMessage(pcVar29,(char *)&local_138,*(int *)&(pNVar22->Pair).Value[1]._vptr_FBaseCVar,
                   (char *)(pNVar24->Pair).Value[1]._vptr_FBaseCVar,
                   (char *)(pNVar17->Pair).Value[1]._vptr_FBaseCVar);
        pDVar27 = StatusBar;
        pDVar16 = (DHUDMessageFadeOut *)
                  M_Malloc_Dbg(200,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                               ,0x1f9);
        DHUDMessageFadeOut::DHUDMessageFadeOut
                  (pDVar16,SmallFont,(char *)&local_138,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
LAB_003fdd41:
        DBaseStatusBar::AttachMessage(pDVar27,&pDVar16->super_DHUDMessage,0x5250534b,0);
      }
      else {
        if (((dmflags2.Value._1_1_ & 0x80) != 0) && (deathmatch.Value != 0)) {
          ppVar14->fragcount = ppVar14->fragcount + -1;
        }
        bVar7 = IsTeammate(this,source);
        ppVar25 = source->player;
        if (bVar7) {
          ppVar25->fragcount = ppVar25->fragcount + -1;
        }
        else {
          ppVar25->fragcount = ppVar25->fragcount + 1;
          ppVar25->spreecount = ppVar25->spreecount + '\x01';
        }
        if (ppVar25->morphTics != 0) {
          GiveInventoryType(source,(PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass);
        }
        if ((deathmatch.Value != 0) && (cl_showsprees.Value == true)) {
          bVar28 = source->player->spreecount;
          if (bVar28 < 0xf) {
            if (bVar28 == 5) {
              pcVar29 = "SPREE5";
              goto LAB_003fdadc;
            }
            if (bVar28 == 10) {
              pcVar29 = "SPREE10";
              goto LAB_003fdadc;
            }
          }
          else {
            if (bVar28 == 0xf) {
              pcVar29 = "SPREE15";
            }
            else if (bVar28 == 0x14) {
              pcVar29 = "SPREE20";
            }
            else {
              if (bVar28 != 0x19) goto LAB_003fdc09;
              pcVar29 = "SPREE25";
            }
LAB_003fdadc:
            pcVar29 = FStringTable::operator()(&GStrings,pcVar29);
            if (pcVar29 != (char *)0x0) {
              bVar7 = AnnounceSpree(source);
              if (!bVar7) {
                pNVar5 = (this->player->userinfo).
                         super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                         .Nodes;
                uVar10 = (this->player->userinfo).
                         super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                         .Size - 1;
                pNVar17 = pNVar5 + (uVar10 & 0x209);
                do {
                  pNVar22 = pNVar17;
                  pNVar17 = pNVar22->Next;
                } while ((pNVar22->Pair).Key.Index != 0x209);
                pNVar5 = pNVar5 + (uVar10 & 0x1ea);
                do {
                  pNVar17 = pNVar5;
                  pNVar5 = pNVar17->Next;
                } while ((pNVar17->Pair).Key.Index != 0x1ea);
                puVar6 = (undefined8 *)
                         ((long)&((source->player->userinfo).
                                  super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                 .Nodes)->Next +
                         (ulong)(((source->player->userinfo).
                                  super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                  .Size - 1 & 0x1ea) * 0x18));
                do {
                  puVar18 = puVar6;
                  puVar6 = (undefined8 *)*puVar18;
                } while (*(int *)(puVar18 + 1) != 0x1ea);
                SexMessage(pcVar29,(char *)&local_138,
                           *(int *)&(pNVar22->Pair).Value[1]._vptr_FBaseCVar,
                           (char *)(pNVar17->Pair).Value[1]._vptr_FBaseCVar,
                           *(char **)(puVar18[2] + 0x28));
                pDVar27 = StatusBar;
                pDVar16 = (DHUDMessageFadeOut *)
                          M_Malloc_Dbg(200,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                       ,0x1f9);
                DHUDMessageFadeOut::DHUDMessageFadeOut
                          (pDVar16,SmallFont,(char *)&local_138,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
                goto LAB_003fdd41;
              }
              goto LAB_003fdd5a;
            }
          }
LAB_003fdc09:
          if ((4 < this->player->spreecount) && (bVar7 = AnnounceSpreeLoss(this), !bVar7)) {
            pcVar29 = FStringTable::operator()(&GStrings,"SPREEOVER");
            pNVar5 = (this->player->userinfo).
                     super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                     Nodes;
            uVar10 = (this->player->userinfo).
                     super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                     Size - 1;
            pNVar17 = pNVar5 + (uVar10 & 0x209);
            do {
              pNVar22 = pNVar17;
              pNVar17 = pNVar22->Next;
            } while ((pNVar22->Pair).Key.Index != 0x209);
            pNVar5 = pNVar5 + (uVar10 & 0x1ea);
            do {
              pNVar17 = pNVar5;
              pNVar5 = pNVar17->Next;
            } while ((pNVar17->Pair).Key.Index != 0x1ea);
            puVar6 = (undefined8 *)
                     ((long)&((source->player->userinfo).
                              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                             .Nodes)->Next +
                     (ulong)(((source->player->userinfo).
                              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                              .Size - 1 & 0x1ea) * 0x18));
            do {
              puVar18 = puVar6;
              puVar6 = (undefined8 *)*puVar18;
            } while (*(int *)(puVar18 + 1) != 0x1ea);
            SexMessage(pcVar29,(char *)&local_138,*(int *)&(pNVar22->Pair).Value[1]._vptr_FBaseCVar,
                       (char *)(pNVar17->Pair).Value[1]._vptr_FBaseCVar,
                       *(char **)(puVar18[2] + 0x28));
            pDVar27 = StatusBar;
            pDVar16 = (DHUDMessageFadeOut *)
                      M_Malloc_Dbg(200,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            DHUDMessageFadeOut::DHUDMessageFadeOut
                      (pDVar16,SmallFont,(char *)&local_138,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
            goto LAB_003fdd41;
          }
        }
      }
LAB_003fdd5a:
      ppVar25 = source->player;
      if (this->player != ppVar25) {
        ppVar25->multicount = ppVar25->multicount + '\x01';
        if (0 < ppVar25->lastkilltime) {
          if (ppVar25->lastkilltime < level.time + -0x69) {
            ppVar25->multicount = '\x01';
          }
          if (((deathmatch.Value != 0) && (bVar7 = CheckLocalView(source,consoleplayer), bVar7)) &&
             (cl_showmultikills.Value == true)) {
            switch(source->player->multicount) {
            case '\x01':
              goto switchD_003fddee_caseD_1;
            case '\x02':
              pcVar29 = "MULTI2";
              break;
            case '\x03':
              pcVar29 = "MULTI3";
              break;
            case '\x04':
              pcVar29 = "MULTI4";
              break;
            default:
              pcVar29 = "MULTI5";
            }
            pcVar29 = FStringTable::operator()(&GStrings,pcVar29);
            if ((pcVar29 != (char *)0x0) && (bVar7 = AnnounceMultikill(source), !bVar7)) {
              pNVar5 = (this->player->userinfo).
                       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes;
              uVar10 = (this->player->userinfo).
                       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Size - 1;
              pNVar17 = pNVar5 + (uVar10 & 0x209);
              do {
                pNVar22 = pNVar17;
                pNVar17 = pNVar22->Next;
              } while ((pNVar22->Pair).Key.Index != 0x209);
              pNVar5 = pNVar5 + (uVar10 & 0x1ea);
              do {
                pNVar17 = pNVar5;
                pNVar5 = pNVar17->Next;
              } while ((pNVar17->Pair).Key.Index != 0x1ea);
              puVar6 = (undefined8 *)
                       ((long)&((source->player->userinfo).
                                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                               .Nodes)->Next +
                       (ulong)(((source->player->userinfo).
                                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                .Size - 1 & 0x1ea) * 0x18));
              do {
                puVar18 = puVar6;
                puVar6 = (undefined8 *)*puVar18;
              } while (*(int *)(puVar18 + 1) != 0x1ea);
              SexMessage(pcVar29,(char *)&local_138,
                         *(int *)&(pNVar22->Pair).Value[1]._vptr_FBaseCVar,
                         (char *)(pNVar17->Pair).Value[1]._vptr_FBaseCVar,
                         *(char **)(puVar18[2] + 0x28));
              pDVar27 = StatusBar;
              pDVar16 = (DHUDMessageFadeOut *)
                        M_Malloc_Dbg(200,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                     ,0x1f9);
              DHUDMessageFadeOut::DHUDMessageFadeOut
                        (pDVar16,SmallFont,(char *)&local_138,1.5,0.8,0,0,CR_RED,3.0,0.5);
              DBaseStatusBar::AttachMessage(pDVar27,(DHUDMessage *)pDVar16,0x4c494b4d,0);
            }
          }
        }
switchD_003fddee_caseD_1:
        ppVar25 = source->player;
        ppVar25->lastkilltime = level.time;
      }
      iVar9 = fraglimit.Value;
      if (((deathmatch.Value != 0) && (fraglimit.Value != 0)) &&
         (iVar8 = D_GetFragCount(ppVar25), iVar9 <= iVar8)) {
        FStringTable::operator()(&GStrings,"TXT_FRAGLIMIT");
        Printf("%s\n");
        G_ExitLevel(0,false);
      }
      goto LAB_003fd4c3;
    }
  }
  if (ppVar14 != (player_t *)0x0) {
    ClientObituary(this,inflictor,source,dmgflags);
    FBehavior::StaticStartTypedScripts(3,this,true,0,false);
    ppVar25 = this->player;
    ppVar25->respawn_time = level.time + 0x23;
    if ((bglobal.botnum != 0) && (demoplayback == false)) {
      pDVar3 = (ppVar25->Bot).field_0.p;
      if (pDVar3 != (DBot *)0x0) {
        if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          uVar10 = FRandom::GenRand32(&pr_botrespawn);
          ((this->player->Bot).field_0.p)->t_respawn =
               (uint)(byte)((char)uVar10 + (char)((uVar10 & 0xff) / 0xf) * -0xf) +
               bglobal.botnum * 2 + 0x22;
        }
        else {
          (ppVar25->Bot).field_0.p = (DBot *)0x0;
        }
      }
      lVar15 = 0x198;
      do {
        lVar21 = *(long *)((long)&players + lVar15);
        if (lVar21 != 0) {
          plVar20 = (long *)((long)&players + lVar15);
          if ((*(byte *)(lVar21 + 0x20) & 0x20) == 0) {
            pAVar4 = *(AActor **)(lVar21 + 0x58);
            if (pAVar4 == (AActor *)0x0) goto LAB_003fd7c2;
            if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
              if (pAVar4 != this) goto LAB_003fd7c2;
              pAVar4 = *(AActor **)(lVar21 + 0x48);
              if ((pAVar4 != (AActor *)0x0) &&
                 ((((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 ||
                  (pAVar4 == this)))) {
                *(undefined8 *)(lVar21 + 0x48) = 0;
                lVar21 = *plVar20;
              }
            }
            plVar20 = (long *)(lVar21 + 0x58);
          }
          *plVar20 = 0;
        }
LAB_003fd7c2:
        lVar15 = lVar15 + 0x2a0;
      } while (lVar15 != 0x1698);
      ppVar25 = this->player;
      ppVar25->multicount = '\0';
      ppVar25->spreecount = '\0';
    }
    if (source == (AActor *)0x0) {
      piVar2 = (int *)((long)ppVar25 +
                      ((long)&ppVar25[-0x9192].secretcount >> 5) * 0x3cf3cf3cf3cf3cf4 + 0xa4);
      *piVar2 = *piVar2 + 1;
      ppVar25->fragcount = ppVar25->fragcount + -1;
    }
    *(byte *)&(this->flags).Value = (byte)(this->flags).Value & 0xfd;
    ppVar25->playerstate = '\x01';
    P_DropWeapon(ppVar25);
    pAVar4 = (AActor *)(&DAT_017e1fb8)[(long)consoleplayer * 0x54];
    if (pAVar4 != (AActor *)0x0) {
      if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        if ((pAVar4 == this) && (automapactive == true)) {
          AM_Stop();
        }
      }
      else {
        (&DAT_017e1fb8)[(long)consoleplayer * 0x54] = 0;
      }
    }
    this->player->extralight = 0;
  }
  if (((this->flags).Value & 0x10000000) == 0) {
    iVar9 = GetGibHealth(this);
    if (inflictor == (AActor *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (inflictor->flags4).Value;
    }
    bVar28 = (uVar10 >> 0x1c & 1) == 0 & ((byte)(uVar10 >> 0x1d) | this->health < iVar9);
    iVar8 = (this->DamageType).super_FName.Index;
    if (iVar8 == 0) {
LAB_003fd8e2:
      (this->DamageType).super_FName.Index = 0;
LAB_003fd8ec:
      if (bVar28 != 0) {
        local_150.Index = 0x8c;
        local_154.Index = 0xce;
        pFVar11 = FindState(this,&local_150,&local_154,true);
        if (pFVar11 != (FState *)0x0) {
LAB_003fd9bd:
          if (bVar28 != 0) goto LAB_003fd9c2;
          goto LAB_003fd9e7;
        }
      }
      local_158.Index = 0x8c;
      pFVar11 = FindState(this,&local_158);
      if (pFVar11 == (FState *)0x0) goto LAB_003fd939;
    }
    else {
      if (iVar8 == 0xce) {
        (this->DamageType).super_FName.Index = 0;
        bVar28 = 1;
        goto LAB_003fd8e2;
      }
      if (bVar28 == 0) {
LAB_003fd996:
        local_144.Index = 0x8c;
        local_148.Index = iVar8;
        pFVar11 = FindState(this,&local_144,&local_148,true);
        if (pFVar11 != (FState *)0x0) {
          bVar28 = 0;
          goto LAB_003fd9bd;
        }
        iVar8 = (this->DamageType).super_FName.Index;
        if (iVar8 != 0x33) {
LAB_003fda9c:
          if (iVar8 != 0xca) goto LAB_003fd8e2;
          goto LAB_003fd8ec;
        }
        if (((deh.NoAutofreeze != 0) || (((this->flags4).Value & 4) != 0)) ||
           ((this->player == (player_t *)0x0 && (((this->flags3).Value & 0x2000) == 0))))
        goto LAB_003fd8e2;
        local_14c.Index = 0x95;
        pFVar11 = FindState(this,&local_14c);
        if (pFVar11 == (FState *)0x0) {
          iVar8 = (this->DamageType).super_FName.Index;
          bVar28 = 0;
          goto LAB_003fda9c;
        }
      }
      else {
        local_138 = 0xce0000008c;
        this_00 = (PClassActor *)(this->super_DThinker).super_DObject.Class;
        local_130 = iVar8;
        if (this_00 == (PClassActor *)0x0) {
          iVar8 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          this_00 = (PClassActor *)CONCAT44(extraout_var_02,iVar8);
          (this->super_DThinker).super_DObject.Class = (PClass *)this_00;
        }
        pFVar11 = PClassActor::FindState(this_00,3,(FName *)&local_138,true);
        if (pFVar11 == (FState *)0x0) {
          iVar8 = (this->DamageType).super_FName.Index;
          goto LAB_003fd996;
        }
LAB_003fd9c2:
        if (this->player == (player_t *)0x0) {
          if (iVar9 <= this->health) {
            this->health = iVar9 + -1;
          }
        }
        else {
          pbVar1 = (byte *)((long)&this->player->cheats + 2);
          *pbVar1 = *pbVar1 | 0x40;
        }
      }
    }
LAB_003fd9e7:
    SetState(this,pFVar11,false);
    if (1 < this->tics) {
      uVar10 = FRandom::GenRand32(&pr_killmobj);
      iVar8 = this->tics - (uVar10 & 3);
      iVar9 = 1;
      if (1 < iVar8) {
        iVar9 = iVar8;
      }
      this->tics = iVar9;
    }
  }
  else {
LAB_003fd939:
    (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  }
  return;
}

Assistant:

void AActor::Die (AActor *source, AActor *inflictor, int dmgflags)
{
	// Handle possible unmorph on death
	bool wasgibbed = (health < GetGibHealth());
	AActor *realthis = NULL;
	int realstyle = 0;
	int realhealth = 0;
	if (P_MorphedDeath(this, &realthis, &realstyle, &realhealth))
	{
		if (!(realstyle & MORPH_UNDOBYDEATHSAVES))
		{
			if (wasgibbed)
			{
				int realgibhealth = realthis->GetGibHealth();
				if (realthis->health >= realgibhealth)
				{
					realthis->health = realgibhealth -1; // if morphed was gibbed, so must original be (where allowed)l
				}
			}
			realthis->CallDie(source, inflictor, dmgflags);
		}
		return;
	}

	// [SO] 9/2/02 -- It's rather funny to see an exploded player body with the invuln sparkle active :) 
	effects &= ~FX_RESPAWNINVUL;
	//flags &= ~MF_INVINCIBLE;

	if (debugfile && this->player)
	{
		static int dieticks[MAXPLAYERS]; // [ZzZombo] not used? Except if for peeking in debugger...
		int pnum = int(this->player-players);
		dieticks[pnum] = gametic;
		fprintf (debugfile, "died (%d) on tic %d (%s)\n", pnum, gametic,
		this->player->cheats&CF_PREDICTING?"predicting":"real");
	}

	// [RH] Notify this actor's items.
	for (AInventory *item = Inventory; item != NULL; )
	{
		AInventory *next = item->Inventory;
		item->OwnerDied();
		item = next;
	}

	if (flags & MF_MISSILE)
	{ // [RH] When missiles die, they just explode
		P_ExplodeMissile (this, NULL, NULL);
		return;
	}
	// [RH] Set the target to the thing that killed it. Strife apparently does this.
	if (source != NULL)
	{
		target = source;
	}

	// [JM] Fire KILL type scripts for actor. Not needed for players, since they have the "DEATH" script type.
	if (!player && !(flags7 & MF7_NOKILLSCRIPTS) && ((flags7 & MF7_USEKILLSCRIPTS) || gameinfo.forcekillscripts))
	{
		FBehavior::StaticStartTypedScripts(SCRIPT_Kill, this, true, 0, true);
	}

	flags &= ~(MF_SHOOTABLE|MF_FLOAT|MF_SKULLFLY);
	if (!(flags4 & MF4_DONTFALL)) flags&=~MF_NOGRAVITY;
	flags |= MF_DROPOFF;
	if ((flags3 & MF3_ISMONSTER) || FindState(NAME_Raise) != NULL || IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{	// [RH] Only monsters get to be corpses.
		// Objects with a raise state should get the flag as well so they can
		// be revived by an Arch-Vile. Batman Doom needs this.
		// [RC] And disable this if DONTCORPSE is set, of course.
		if(!(flags6 & MF6_DONTCORPSE)) flags |= MF_CORPSE;
	}
	flags6 |= MF6_KILLED;

	// [RH] Allow the death height to be overridden using metadata.
	double metaheight = -1;
	if (DamageType == NAME_Fire)
	{
		metaheight = GetClass()->BurnHeight;
	}
	if (metaheight < 0)
	{
		metaheight = GetClass()->DeathHeight;
	}
	if (metaheight < 0)
	{
		Height *= 0.25;
	}
	else
	{
		Height = MAX<double> (metaheight, 0);
	}

	// [RH] If the thing has a special, execute and remove it
	//		Note that the thing that killed it is considered
	//		the activator of the script.
	// New: In Hexen, the thing that died is the activator,
	//		so now a level flag selects who the activator gets to be.
	// Everything is now moved to P_ActivateThingSpecial().
	if (special && (!(flags & MF_SPECIAL) || (flags3 & MF3_ISMONSTER))
		&& !(activationtype & THINGSPEC_NoDeathSpecial))
	{
		P_ActivateThingSpecial(this, source, true); 
	}

	if (CountsAsKill())
		level.killed_monsters++;
		
	if (source && source->player)
	{
		if (CountsAsKill())
		{ // count for intermission
			source->player->killcount++;
		}

		// Don't count any frags at level start, because they're just telefrags
		// resulting from insufficient deathmatch starts, and it wouldn't be
		// fair to count them toward a player's score.
		if (player && level.maptime)
		{
			source->player->frags[player - players]++;
			if (player == source->player)	// [RH] Cumulative frag count
			{
				char buff[256];

				player->fragcount--;
				if (deathmatch && player->spreecount >= 5 && cl_showsprees)
				{
					SexMessage (GStrings("SPREEKILLSELF"), buff,
						player->userinfo.GetGender(), player->userinfo.GetName(),
						player->userinfo.GetName());
					StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
							1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
				}
			}
			else
			{
				if ((dmflags2 & DF2_YES_LOSEFRAG) && deathmatch)
					player->fragcount--;

				if (this->IsTeammate(source))
				{
					source->player->fragcount--;
				}
				else
				{
					++source->player->fragcount;
					++source->player->spreecount;
				}

				if (source->player->morphTics)
				{ // Make a super chicken
					source->GiveInventoryType (RUNTIME_CLASS(APowerWeaponLevel2));
				}

				if (deathmatch && cl_showsprees)
				{
					const char *spreemsg;
					char buff[256];

					switch (source->player->spreecount)
					{
					case 5:
						spreemsg = GStrings("SPREE5");
						break;
					case 10:
						spreemsg = GStrings("SPREE10");
						break;
					case 15:
						spreemsg = GStrings("SPREE15");
						break;
					case 20:
						spreemsg = GStrings("SPREE20");
						break;
					case 25:
						spreemsg = GStrings("SPREE25");
						break;
					default:
						spreemsg = NULL;
						break;
					}

					if (spreemsg == NULL && player->spreecount >= 5)
					{
						if (!AnnounceSpreeLoss (this))
						{
							SexMessage (GStrings("SPREEOVER"), buff, player->userinfo.GetGender(),
								player->userinfo.GetName(), source->player->userinfo.GetName());
							StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
								1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
						}
					}
					else if (spreemsg != NULL)
					{
						if (!AnnounceSpree (source))
						{
							SexMessage (spreemsg, buff, player->userinfo.GetGender(),
								player->userinfo.GetName(), source->player->userinfo.GetName());
							StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
								1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
						}
					}
				}
			}

			// [RH] Multikills
			if (player != source->player)
			{
				source->player->multicount++;
				if (source->player->lastkilltime > 0)
				{
					if (source->player->lastkilltime < level.time - 3*TICRATE)
					{
						source->player->multicount = 1;
					}

					if (deathmatch &&
						source->CheckLocalView (consoleplayer) &&
						cl_showmultikills)
					{
						const char *multimsg;

						switch (source->player->multicount)
						{
						case 1:
							multimsg = NULL;
							break;
						case 2:
							multimsg = GStrings("MULTI2");
							break;
						case 3:
							multimsg = GStrings("MULTI3");
							break;
						case 4:
							multimsg = GStrings("MULTI4");
							break;
						default:
							multimsg = GStrings("MULTI5");
							break;
						}
						if (multimsg != NULL)
						{
							char buff[256];

							if (!AnnounceMultikill (source))
							{
								SexMessage (multimsg, buff, player->userinfo.GetGender(),
									player->userinfo.GetName(), source->player->userinfo.GetName());
								StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
									1.5f, 0.8f, 0, 0, CR_RED, 3.f, 0.5f), MAKE_ID('M','K','I','L'));
							}
						}
					}
				}
				source->player->lastkilltime = level.time;
			}

			// [RH] Implement fraglimit
			if (deathmatch && fraglimit &&
				fraglimit <= D_GetFragCount (source->player))
			{
				Printf ("%s\n", GStrings("TXT_FRAGLIMIT"));
				G_ExitLevel (0, false);
			}
		}
	}
	else if (!multiplayer && CountsAsKill())
	{
		// count all monster deaths,
		// even those caused by other monsters
		players[0].killcount++;
	}

	if (player)
	{
		// [RH] Death messages
		ClientObituary (this, inflictor, source, dmgflags);

		// Death script execution, care of Skull Tag
		FBehavior::StaticStartTypedScripts (SCRIPT_Death, this, true);

		// [RH] Force a delay between death and respawn
		player->respawn_time = level.time + TICRATE;

		//Added by MC: Respawn bots
		if (bglobal.botnum && !demoplayback)
		{
			if (player->Bot != NULL)
				player->Bot->t_respawn = (pr_botrespawn()%15)+((bglobal.botnum-1)*2)+TICRATE+1;

			//Added by MC: Discard enemies.
			for (int i = 0; i < MAXPLAYERS; i++)
			{
				if (players[i].Bot != NULL && this == players[i].Bot->enemy)
				{
					if (players[i].Bot->dest ==  players[i].Bot->enemy)
						players[i].Bot->dest = NULL;
					players[i].Bot->enemy = NULL;
				}
			}

			player->spreecount = 0;
			player->multicount = 0;
		}

		// count environment kills against you
		if (!source)
		{
			player->frags[player - players]++;
			player->fragcount--;	// [RH] Cumulative frag count
		}
						
		flags &= ~MF_SOLID;
		player->playerstate = PST_DEAD;
		P_DropWeapon (player);
		if (this == players[consoleplayer].camera && automapactive)
		{
			// don't die in auto map, switch view prior to dying
			AM_Stop ();
		}

		// [GRB] Clear extralight. When you killed yourself with weapon that
		// called A_Light1/2 before it called A_Light0, extraligh remained.
		player->extralight = 0;
	}

	// [RH] If this is the unmorphed version of another monster, destroy this
	// actor, because the morphed version is the one that will stick around in
	// the level.
	if (flags & MF_UNMORPHED)
	{
		Destroy ();
		return;
	}



	FState *diestate = NULL;
	int gibhealth = GetGibHealth();
	ActorFlags4 iflags4 = inflictor == NULL ? ActorFlags4::FromInt(0) : inflictor->flags4;
	bool extremelydead = ((health < gibhealth || iflags4 & MF4_EXTREMEDEATH) && !(iflags4 & MF4_NOEXTREMEDEATH));

	// Special check for 'extreme' damage type to ensure that it gets recorded properly as an extreme death for subsequent checks.
	if (DamageType == NAME_Extreme)
	{
		extremelydead = true;
		DamageType = NAME_None;
	}

	// find the appropriate death state. The order is:
	//
	// 1. If damagetype is not 'none' and death is extreme, try a damage type specific extreme death state
	// 2. If no such state is found or death is not extreme try a damage type specific normal death state
	// 3. If damagetype is 'ice' and actor is a monster or player, try the generic freeze death (unless prohibited)
	// 4. If no state has been found and death is extreme, try the extreme death state
	// 5. If no such state is found or death is not extreme try the regular death state.
	// 6. If still no state has been found, destroy the actor immediately.

	if (DamageType != NAME_None)
	{
		if (extremelydead)
		{
			FName labels[] = { NAME_Death, NAME_Extreme, DamageType };
			diestate = FindState(3, labels, true);
		}
		if (diestate == NULL)
		{
			diestate = FindState (NAME_Death, DamageType, true);
			if (diestate != NULL) extremelydead = false;
		}
		if (diestate == NULL)
		{
			if (DamageType == NAME_Ice)
			{ // If an actor doesn't have an ice death, we can still give them a generic one.

				if (!deh.NoAutofreeze && !(flags4 & MF4_NOICEDEATH) && (player || (flags3 & MF3_ISMONSTER)))
				{
					diestate = FindState(NAME_GenericFreezeDeath);
					extremelydead = false;
				}
			}
		}
	}
	if (diestate == NULL)
	{
		
		// Don't pass on a damage type this actor cannot handle.
		// (most importantly, prevent barrels from passing on ice damage.)
		// Massacre must be preserved though.
		if (DamageType != NAME_Massacre)
		{
			DamageType = NAME_None;	
		}

		if (extremelydead)
		{ // Extreme death
			diestate = FindState (NAME_Death, NAME_Extreme, true);
		}
		if (diestate == NULL)
		{ // Normal death
			extremelydead = false;
			diestate = FindState (NAME_Death);
		}
	}

	if (extremelydead)
	{ 
		// We'll only get here if an actual extreme death state was used.

		// For players, mark the appropriate flag.
		if (player != NULL)
		{
			player->cheats |= CF_EXTREMELYDEAD;
		}
		// If a non-player, mark as extremely dead for the crash state.
		else if (health >= gibhealth)
		{
			health = gibhealth - 1;
		}
	}

	if (diestate != NULL)
	{
		SetState (diestate);

		if (tics > 1)
		{
			tics -= pr_killmobj() & 3;
			if (tics < 1)
				tics = 1;
		}
	}
	else
	{
		Destroy();
	}
}